

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replace_desc_array_access_using_var_index.cpp
# Opt level: O2

void __thiscall
spvtools::opt::ReplaceDescArrayAccessUsingVarIndex::AddConstElementAccessToCaseBlock
          (ReplaceDescArrayAccessUsingVarIndex *this,BasicBlock *case_block,
          Instruction *access_chain,uint32_t const_element_idx,
          unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
          *old_ids_to_new_ids)

{
  uint32_t res_id;
  Instruction *access_chain_00;
  mapped_type *pmVar1;
  DefUseManager *this_00;
  uint32_t local_2c;
  
  access_chain_00 = Instruction::Clone(access_chain,(this->super_Pass).context_);
  UseConstIndexForAccessChain(this,access_chain_00,const_element_idx);
  res_id = IRContext::TakeNextId((this->super_Pass).context_);
  local_2c = Instruction::result_id(access_chain_00);
  pmVar1 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)old_ids_to_new_ids,&local_2c);
  *pmVar1 = res_id;
  Instruction::SetResultId(access_chain_00,res_id);
  this_00 = Pass::get_def_use_mgr(&this->super_Pass);
  analysis::DefUseManager::AnalyzeInstDefUse(this_00,access_chain_00);
  IRContext::set_instr_block((this->super_Pass).context_,access_chain_00,case_block);
  utils::IntrusiveNodeBase<spvtools::opt::Instruction>::InsertBefore
            (&access_chain_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>,
             &(case_block->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_);
  return;
}

Assistant:

void ReplaceDescArrayAccessUsingVarIndex::AddConstElementAccessToCaseBlock(
    BasicBlock* case_block, Instruction* access_chain,
    uint32_t const_element_idx,
    std::unordered_map<uint32_t, uint32_t>* old_ids_to_new_ids) const {
  std::unique_ptr<Instruction> access_clone(access_chain->Clone(context()));
  UseConstIndexForAccessChain(access_clone.get(), const_element_idx);

  uint32_t new_access_id = context()->TakeNextId();
  (*old_ids_to_new_ids)[access_clone->result_id()] = new_access_id;
  access_clone->SetResultId(new_access_id);
  get_def_use_mgr()->AnalyzeInstDefUse(access_clone.get());

  context()->set_instr_block(access_clone.get(), case_block);
  case_block->AddInstruction(std::move(access_clone));
}